

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wildmidi_lib.cpp
# Opt level: O2

char * wm_strdup(char *str)

{
  size_t sVar1;
  char *pcVar2;
  
  sVar1 = strlen(str);
  pcVar2 = (char *)malloc(sVar1 + 5);
  if (pcVar2 != (char *)0x0) {
    pcVar2 = strcpy(pcVar2,str);
    return pcVar2;
  }
  return (char *)0x0;
}

Assistant:

static char *wm_strdup (const char *str) {
	size_t l = strlen(str) + 5;
	char *d = (char *) malloc(l * sizeof(char));
	if (d) {
		strcpy(d, str);
		return d;
	}
	return NULL;
}